

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardChars.h
# Opt level: O2

void __thiscall
UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>::CaseMapper
          (CaseMapper<UnifiedRegex::TrivialCaseMapper> *this,ArenaAllocator *allocator,
          MappingSource mappingSource,TrivialCaseMapper *fallbackMapper)

{
  char16 cVar1;
  bool bVar2;
  Char kc;
  int i;
  uint uVar3;
  uint u;
  uint64 r;
  unsigned_long v;
  char16 local_44 [4];
  char16 equivl [4];
  uint tblidx;
  uint acth;
  
  CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::CharMap
            (&this->toEquivs,0xffffffffffffffff);
  this->fallbackMapper = fallbackMapper;
  equivl[0] = L'\0';
  equivl[1] = L'\0';
  uVar3 = 0;
  equivl._4_4_ = ZEXT14(mappingSource);
  do {
    bVar2 = CaseInsensitive::RangeToEquivClassOnlyInSource
                      ((MappingSource)equivl._4_4_,(uint *)equivl,uVar3,0xffff,&tblidx,local_44);
    u = uVar3;
    if (bVar2) {
      do {
        v = 0;
        for (uVar3 = 3; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
          cVar1 = equivl[(ulong)uVar3 - 4];
          equivl[(ulong)uVar3 - 4] = cVar1 + L'\x01';
          v = v << 0x10 | (ulong)(ushort)cVar1;
        }
        uVar3 = u + 1;
        kc = Chars<char16_t>::UTC(u);
        CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::Set
                  (&this->toEquivs,allocator,kc,v);
        u = uVar3;
      } while (uVar3 <= tblidx);
    }
    else {
      uVar3 = tblidx + 1;
    }
  } while (uVar3 < 0x10000);
  return;
}

Assistant:

CaseMapper(ArenaAllocator *allocator, CaseInsensitive::MappingSource mappingSource, const FallbackCaseMapper *fallbackMapper) :
            toEquivs((uint64) -1),
            fallbackMapper(fallbackMapper)
        {
            CompileAssert(sizeof(char16) == 2);
            CompileAssert(sizeof(uint) > sizeof(char16));

            const uint maxUChar = Chars<char16>::MaxUChar;
            uint l = 0;
            uint h = maxUChar;
            uint tblidx = 0;
            do {
                uint acth;
                char16 equivl[CaseInsensitive::EquivClassSize];
                bool isNonTrivial = CaseInsensitive::RangeToEquivClassOnlyInSource(mappingSource, tblidx, l, h, acth, equivl);
                if (isNonTrivial)
                {
                    __assume(acth <= maxUChar); // property of algorithm: acth never greater than h
                    do
                    {
                        uint64 r = 0;
                        CompileAssert(sizeof(r) >= sizeof(char16) * CaseInsensitive::EquivClassSize);

                        for (int i = CaseInsensitive::EquivClassSize - 1; i >= 0; i--)
                        {
                            __assume(equivl[i] <= maxUChar); // property of algorithm: never map outside of range
                            r <<= 16;
                            r |= Chars<char16>::CTU(equivl[i]++);
                        }
                        toEquivs.Set(allocator, Chars<char16>::UTC(l++), r);
                    }
                    while (l <= acth);
                }
                else
                {
                    l = acth + 1;
                }
            }
            while (l <= h);
        }